

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t
ctrl_set_skip_postproc_filtering(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  uint *puVar3;
  av1_extracfg extra_cfg;
  av1_extracfg aStack_268;
  
  aVar2 = AOM_CODEC_INCAPABLE;
  if ((ctx->cfg).g_usage == 2) {
    memcpy(&aStack_268,&ctx->extra_cfg,600);
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar3 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar3 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar3 + 2;
    }
    aStack_268.skip_postproc_filtering = *puVar3;
    aVar2 = update_extra_cfg(ctx,&aStack_268);
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_skip_postproc_filtering(
    aom_codec_alg_priv_t *ctx, va_list args) {
  // Skipping the application of post-processing filters is allowed only
  // for ALLINTRA mode.
  if (ctx->cfg.g_usage != AOM_USAGE_ALL_INTRA) return AOM_CODEC_INCAPABLE;
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.skip_postproc_filtering =
      CAST(AV1E_SET_SKIP_POSTPROC_FILTERING, args);
  return update_extra_cfg(ctx, &extra_cfg);
}